

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O3

void scp_error_send_message_cb(void *vscp)

{
  undefined8 *puVar1;
  char *__s;
  size_t sVar2;
  
  puVar1 = *vscp;
  __s = *(char **)((long)vscp + 8);
  sVar2 = strlen(__s);
  (**(code **)*puVar1)(puVar1,1,__s,sVar2);
  (**(code **)**vscp)(*vscp,1,"\n",1);
  (**(code **)(**vscp + 0x38))(*vscp,1);
  (**(code **)(**vscp + 8))();
  (**(code **)(**vscp + 0x10))(*vscp,*(undefined8 *)((long)vscp + 8));
  return;
}

Assistant:

static void scp_error_send_message_cb(void *vscp)
{
    ScpError *scp = (ScpError *)vscp;
    sshfwd_write_ext(scp->sc, true, scp->message, strlen(scp->message));
    sshfwd_write_ext(scp->sc, true, "\n", 1);
    sshfwd_send_exit_status(scp->sc, 1);
    sshfwd_write_eof(scp->sc);
    sshfwd_initiate_close(scp->sc, scp->message);
}